

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArbitraryInteger.cpp
# Opt level: O2

void __thiscall Refal2::CArbitraryInteger::Add(CArbitraryInteger *this,CArbitraryInteger *operand)

{
  removeLeadingZeros(this);
  removeLeadingZeros(operand);
  if (this->isNegative == operand->isNegative) {
    add(this,operand);
  }
  else {
    sub(this,operand);
  }
  removeLeadingZeros(this);
  return;
}

Assistant:

void CArbitraryInteger::Add( const CArbitraryInteger& operand )
{
	removeLeadingZeros();
	const_cast<CArbitraryInteger&>( operand ).removeLeadingZeros();
	if( IsNegative() == operand.IsNegative() ) {
		// result sign will be the same of operands
		add( operand );
	} else {
		sub( operand );
	}
	removeLeadingZeros();
}